

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool __thiscall libwebm::Webm2Pes::InitWebmParser(Webm2Pes *this)

{
  FILE *pFVar1;
  __type _Var2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  longlong lVar6;
  pointer pSVar7;
  long lVar8;
  Tracks *this_00;
  SegmentInfo *this_01;
  unsigned_long uVar9;
  Track *this_02;
  int local_b8;
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  _anonymous_namespace_ local_58 [8];
  string codec_id;
  Track *track;
  int track_index;
  Tracks *tracks;
  Segment *webm_parser;
  Webm2Pes *this_local;
  
  webm_parser = (Segment *)this;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = mkvparser::MkvReader::Open(&this->webm_reader_,pcVar4);
  pFVar1 = _stderr;
  if (iVar3 == 0) {
    tracks = (Tracks *)0x0;
    lVar6 = mkvparser::Segment::CreateInstance
                      (&(this->webm_reader_).super_IMkvReader,0,(Segment **)&tracks,kTypeSeekable);
    if (lVar6 == 0) {
      std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::reset
                (&this->webm_parser_,(pointer)tracks);
      pSVar7 = std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::
               operator->(&this->webm_parser_);
      lVar8 = mkvparser::Segment::Load(pSVar7);
      pFVar1 = _stderr;
      if (lVar8 == 0) {
        pSVar7 = std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::
                 operator->(&this->webm_parser_);
        this_00 = mkvparser::Segment::GetTracks(pSVar7);
        pFVar1 = _stderr;
        if (this_00 == (Tracks *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"Webm2Pes: %s has no tracks.\n",uVar5);
          this_local._7_1_ = 0;
        }
        else {
          pSVar7 = std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::
                   operator->(&this->webm_parser_);
          this_01 = mkvparser::Segment::GetInfo(pSVar7);
          lVar6 = mkvparser::SegmentInfo::GetTimeCodeScale(this_01);
          this->timecode_scale_ = lVar6;
          for (track._4_4_ = 0; uVar9 = mkvparser::Tracks::GetTracksCount(this_00),
              track._4_4_ < (int)uVar9; track._4_4_ = track._4_4_ + 1) {
            this_02 = mkvparser::Tracks::GetTrackByIndex(this_00,(long)track._4_4_);
            if ((this_02 != (Track *)0x0) &&
               (lVar8 = mkvparser::Track::GetType(this_02), lVar8 == 1)) {
              pcVar4 = mkvparser::Track::GetCodecId(this_02);
              (anonymous_namespace)::ToString_abi_cxx11_(local_58,pcVar4);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_78,"V_VP8",&local_79);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_78);
              std::__cxx11::string::~string(local_78);
              std::allocator<char>::~allocator((allocator<char> *)&local_79);
              if (_Var2) {
                this->codec_ = kVP8;
LAB_0011a52f:
                this->video_track_num_ = track._4_4_ + 1;
                local_b8 = 2;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b0,"V_VP9",&local_b1);
                _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_58,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0);
                std::__cxx11::string::~string(local_b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_b1);
                if (_Var2) {
                  this->codec_ = kVP9;
                  goto LAB_0011a52f;
                }
                fprintf(_stderr,"Webm2Pes: Codec must be VP8 or VP9.\n");
                this_local._7_1_ = 0;
                local_b8 = 1;
              }
              std::__cxx11::string::~string((string *)local_58);
              if (local_b8 == 1) goto LAB_0011a5c8;
              break;
            }
          }
          pFVar1 = _stderr;
          if (this->video_track_num_ < 1) {
            uVar5 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"Webm2Pes: No video track found in %s.\n",uVar5);
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = 1;
          }
        }
      }
      else {
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar1,"Webm2Pes: Cannot parse %s.\n",uVar5);
        this_local._7_1_ = 0;
      }
    }
    else {
      fprintf(_stderr,"Webm2Pes: Cannot create WebM parser.\n");
      this_local._7_1_ = 0;
    }
  }
  else {
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Webm2Pes: Cannot open %s as input.\n",uVar5);
    this_local._7_1_ = 0;
  }
LAB_0011a5c8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Webm2Pes::InitWebmParser() {
  if (webm_reader_.Open(input_file_name_.c_str()) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot open %s as input.\n",
                 input_file_name_.c_str());
    return false;
  }

  using mkvparser::Segment;
  Segment* webm_parser = nullptr;
  if (Segment::CreateInstance(&webm_reader_, 0 /* pos */,
                              webm_parser /* Segment*& */) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot create WebM parser.\n");
    return false;
  }
  webm_parser_.reset(webm_parser);

  if (webm_parser_->Load() != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot parse %s.\n",
                 input_file_name_.c_str());
    return false;
  }

  // Make sure there's a video track.
  const mkvparser::Tracks* tracks = webm_parser_->GetTracks();
  if (tracks == nullptr) {
    std::fprintf(stderr, "Webm2Pes: %s has no tracks.\n",
                 input_file_name_.c_str());
    return false;
  }

  timecode_scale_ = webm_parser_->GetInfo()->GetTimeCodeScale();

  for (int track_index = 0;
       track_index < static_cast<int>(tracks->GetTracksCount());
       ++track_index) {
    const mkvparser::Track* track = tracks->GetTrackByIndex(track_index);
    if (track && track->GetType() == mkvparser::Track::kVideo) {
      const std::string codec_id = ToString(track->GetCodecId());
      if (codec_id == std::string("V_VP8")) {
        codec_ = VideoFrame::kVP8;
      } else if (codec_id == std::string("V_VP9")) {
        codec_ = VideoFrame::kVP9;
      } else {
        fprintf(stderr, "Webm2Pes: Codec must be VP8 or VP9.\n");
        return false;
      }
      video_track_num_ = track_index + 1;
      break;
    }
  }
  if (video_track_num_ < 1) {
    std::fprintf(stderr, "Webm2Pes: No video track found in %s.\n",
                 input_file_name_.c_str());
    return false;
  }
  return true;
}